

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O1

bool TestDerive(FileTest *t,KeyMap *key_map,EVP_PKEY *key)

{
  EVP_PKEY_CTX *ctx_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  long lVar5;
  AssertionResult gtest_ar_;
  size_t len;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actual;
  UniquePtr<EVP_PKEY_CTX> ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  UniquePtr<EVP_PKEY_CTX> copy;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  Bytes local_90;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  FileTest *local_58;
  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> local_50;
  AssertHelper local_48;
  EVP_PKEY_CTX *local_40;
  evp_pkey_ctx_st *local_38;
  
  bVar1 = false;
  local_58 = t;
  local_80._M_head_impl = (evp_pkey_ctx_st *)EVP_PKEY_CTX_new((EVP_PKEY *)key,(ENGINE *)0x0);
  if (local_80._M_head_impl != (EVP_PKEY_CTX *)0x0) {
    iVar3 = EVP_PKEY_derive_init((EVP_PKEY_CTX *)local_80._M_head_impl);
    if ((iVar3 == 0) || (bVar1 = SetupContext(local_58,key_map,local_80._M_head_impl), !bVar1)) {
      bVar1 = false;
    }
    else {
      local_50._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
           EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)local_80._M_head_impl);
      if (local_50._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
        bVar1 = false;
      }
      else {
        local_40 = local_80._M_head_impl;
        local_38 = (evp_pkey_ctx_st *)
                   local_50._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl;
        bVar1 = false;
        lVar5 = 0;
        do {
          ctx_00 = *(EVP_PKEY_CTX **)((long)&local_40 + lVar5);
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar3 = EVP_PKEY_derive(ctx_00,(uchar *)0x0,(size_t *)&local_d0);
          if (iVar3 == 0) {
LAB_00295f97:
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete(local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((long *)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            break;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_a8,(size_type)local_d0);
          iVar3 = EVP_PKEY_derive(ctx_00,local_a8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                  (size_t *)&local_d0);
          if (iVar3 == 0) goto LAB_00295f97;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_a8,(size_type)local_d0);
          local_c8 = (undefined1  [8])&local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Output","");
          bVar2 = FileTest::GetBytes(local_58,&local_78,(string *)local_c8);
          if (local_c8 != (undefined1  [8])&local_b8) {
            operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00295f97;
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     -(long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          local_e0 = (undefined1  [8])
                     local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_90.span_.size_ =
               (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_90.span_.data_ =
               local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_c8,"Bytes(output)","Bytes(actual)",(Bytes *)local_e0,
                     &local_90);
          if (local_c8[0] == '\0') {
            testing::Message::Message((Message *)local_e0);
            pcVar4 = "";
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = (local_c0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x160,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_90,(Message *)local_e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
            if (local_e0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_e0 + 8))();
            }
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_a8,(size_type)((long)&(local_d0->_M_dataplus)._M_p + 1));
          local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     -(long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          iVar3 = EVP_PKEY_derive(ctx_00,local_a8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                  (size_t *)&local_d0);
          if (iVar3 == 0) goto LAB_00295f97;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_a8,(size_type)local_d0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     -(long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          local_e0 = (undefined1  [8])
                     local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_90.span_.size_ =
               (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_90.span_.data_ =
               local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_c8,"Bytes(output)","Bytes(actual)",(Bytes *)local_e0,
                     &local_90);
          if (local_c8[0] == '\0') {
            testing::Message::Message((Message *)local_e0);
            pcVar4 = "";
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = (local_c0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x169,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_90,(Message *)local_e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
            if (local_e0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_e0 + 8))();
            }
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_a8,(size_type)((long)&local_d0[-1].field_2 + 0xf));
          local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     -(long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          local_c8 = (undefined1  [8])&local_b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"SmallBufferTruncates","");
          bVar2 = FileTest::HasAttribute(local_58,(string *)local_c8);
          if (local_c8 != (undefined1  [8])&local_b8) {
            operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
          }
          if (bVar2) {
            iVar3 = EVP_PKEY_derive(ctx_00,local_a8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                    (size_t *)&local_d0);
            if (iVar3 == 0) goto LAB_00295f97;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_a8,(size_type)local_d0);
            local_e0 = (undefined1  [8])
                       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            local_d8 = local_d0;
            local_90.span_.size_ =
                 (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            local_90.span_.data_ =
                 local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)local_c8,"Bytes(output.data(), len)","Bytes(actual)",
                       (Bytes *)local_e0,&local_90);
            if (local_c8[0] == '\0') {
              testing::Message::Message((Message *)local_e0);
              pcVar4 = "";
              if (local_c0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = (local_c0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_90,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0x173,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_90,(Message *)local_e0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
              if (local_e0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_e0 + 8))();
              }
            }
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c0,local_c0);
            }
          }
          else {
            iVar3 = EVP_PKEY_derive(ctx_00,local_a8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                    (size_t *)&local_d0);
            local_e0[0] = iVar3 == 0;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 != 0) {
              testing::Message::Message((Message *)&local_90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_c8,(internal *)local_e0,
                         (AssertionResult *)"EVP_PKEY_derive(pctx, actual.data(), &len)","true",
                         "false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0x175,(char *)local_c8);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_90);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if (local_c8 != (undefined1  [8])&local_b8) {
                operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
              }
              if ((long *)local_90.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_90.span_.data_ + 8))();
              }
            }
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,local_d8);
            }
            ERR_clear_error();
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((long *)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
            operator_delete(local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar5 = lVar5 + 8;
          bVar1 = lVar5 == 0x10;
        } while (!bVar1);
      }
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    }
  }
  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&local_80);
  return bVar1;
}

Assistant:

static bool TestDerive(FileTest *t, KeyMap *key_map, EVP_PKEY *key) {
  bssl::UniquePtr<EVP_PKEY_CTX> ctx(EVP_PKEY_CTX_new(key, nullptr));
  if (!ctx ||
      !EVP_PKEY_derive_init(ctx.get()) ||
      !SetupContext(t, key_map, ctx.get())) {
    return false;
  }

  bssl::UniquePtr<EVP_PKEY_CTX> copy(EVP_PKEY_CTX_dup(ctx.get()));
  if (!copy) {
    return false;
  }

  for (EVP_PKEY_CTX *pctx : {ctx.get(), copy.get()}) {
    size_t len;
    std::vector<uint8_t> actual, output;
    if (!EVP_PKEY_derive(pctx, nullptr, &len)) {
      return false;
    }
    actual.resize(len);
    if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
      return false;
    }
    actual.resize(len);

    // Defer looking up the attribute so Error works properly.
    if (!t->GetBytes(&output, "Output")) {
      return false;
    }
    EXPECT_EQ(Bytes(output), Bytes(actual));

    // Test when the buffer is too large.
    actual.resize(len + 1);
    len = actual.size();
    if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
      return false;
    }
    actual.resize(len);
    EXPECT_EQ(Bytes(output), Bytes(actual));

    // Test when the buffer is too small.
    actual.resize(len - 1);
    len = actual.size();
    if (t->HasAttribute("SmallBufferTruncates")) {
      if (!EVP_PKEY_derive(pctx, actual.data(), &len)) {
        return false;
      }
      actual.resize(len);
      EXPECT_EQ(Bytes(output.data(), len), Bytes(actual));
    } else {
      EXPECT_FALSE(EVP_PKEY_derive(pctx, actual.data(), &len));
      ERR_clear_error();
    }
  }
  return true;
}